

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

bool __thiscall IceCore::Container::Delete(Container *this,udword entry)

{
  udword *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = (ulong)this->mCurNbEntries;
  if (uVar4 == 0) {
    return false;
  }
  puVar1 = this->mEntries;
  if (*puVar1 == entry) {
    bVar7 = true;
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (uVar4 - 1 == uVar6) {
        return false;
      }
      uVar5 = uVar6 + 1;
      lVar2 = uVar6 + 1;
      uVar6 = uVar5;
    } while (puVar1[lVar2] != entry);
    bVar7 = uVar5 < uVar4;
  }
  uVar3 = this->mCurNbEntries - 1;
  this->mCurNbEntries = uVar3;
  puVar1[uVar5] = puVar1[uVar3];
  return bVar7;
}

Assistant:

bool Container::Delete(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i. The strategy is to copy the last current entry at index i, and decrement the current number of entries.
			DeleteIndex(i);
			return true;
		}
	}
	return false;
}